

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

symbol * lsvm::symbol::new_symbol(string *symbol)

{
  string_char sVar1;
  uint uVar2;
  hashset *h;
  entry *peVar3;
  string *val;
  undefined8 *puVar4;
  iterator iVar5;
  iterator it;
  
  if (symbol->size == 0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "string empty";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  iVar5 = string::get_iterator(symbol);
  it.s = iVar5.s;
  it.p = iVar5.p;
  sVar1 = string::next(&it);
  uVar2 = sVar1 - 0x41;
  if (uVar2 < 0x1a) {
LAB_0010465e:
    h = (hashset *)(&symbols_alpha)[uVar2];
    if ((hashset *)(&symbols_alpha)[uVar2] != (hashset *)0x0) goto LAB_00104692;
    puVar4 = &symbols_alpha + uVar2;
  }
  else {
    if (sVar1 - 0x61 < 0x1a) {
      uVar2 = sVar1 - 0x47;
      goto LAB_0010465e;
    }
    h = symbols_other;
    if (symbols_other != (hashset *)0x0) goto LAB_00104692;
    puVar4 = &symbols_other;
  }
  h = hashset::new_stringset();
  *puVar4 = h;
LAB_00104692:
  peVar3 = hashset::get(h,symbol);
  if (peVar3 == (entry *)0x0) {
    val = string::new_string(symbol);
    hashset::put(h,val);
  }
  else {
    val = (string *)peVar3->val;
  }
  return val;
}

Assistant:

symbol* new_symbol(lsvm::string::string* symbol){
    if(lsvm::string::size(symbol) == 0)
        throw "string empty";

    lsvm::string::iterator it = lsvm::string::get_iterator(symbol);
    lsvm::string::string_char c = lsvm::string::next(&it);

    lsvm::hashset::hashset* table;
    if(alpha1(c)){
        table = symbols_alpha[c-0x41];
        if(table == null){
            table = lsvm::hashset::new_stringset();
            symbols_alpha[c-0x41] = table;
        }
    }else if(alpha2(c)){
        table = symbols_alpha[c-0x61+0x1A];
        if(table == null){
            table = lsvm::hashset::new_stringset();
            symbols_alpha[c-0x61+0x1A] = table;
        }
    }else{
        table = symbols_other;
        if(table == null){
            table = lsvm::hashset::new_stringset();
            symbols_other = table;
        }
    }

    lsvm::hashset::entry* entry = lsvm::hashset::get(table,symbol);
    if(entry == null){
        lsvm::string::string* s = lsvm::string::new_string(symbol);
        lsvm::hashset::put(table,s);
        return s;
    }else{
        return reinterpret_cast<lsvm::symbol::symbol*>(entry->val);
    }
}